

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O1

event_set *
afsm::detail::state_base_impl<afsm::test::ortho_sm_def,_false>::static_deferrable_events(void)

{
  if (state_base_impl<afsm::test::ortho_sm_def,false>::static_deferrable_events()::evts_ == '\0') {
    state_base_impl<afsm::test::ortho_sm_def,false>::static_deferrable_events();
  }
  return &static_deferrable_events::evts_;
}

Assistant:

static event_set const&
    static_deferrable_events()
    {
        static event_set evts_ = make_event_set(deferred_events{});
        return evts_;
    }